

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O1

void __thiscall Shell::EqualityProxy::addLocalAxioms(EqualityProxy *this,UnitList **units)

{
  UnitList *pUVar1;
  uint uVar2;
  Literal *pLVar3;
  Clause *pCVar4;
  UnitList *pUVar5;
  ulong uVar6;
  Stack<Kernel::Literal_*> local_98;
  Inference local_78;
  NonspecificInference1 local_40;
  
  local_98._cursor = (Literal **)0x0;
  local_98._end = (Literal **)0x0;
  local_98._capacity = 0;
  local_98._stack = (Literal **)0x0;
  uVar2 = getProxyPredicate(this);
  local_78._0_8_ = 1;
  local_78._8_4_ = 5;
  local_78._age = 0;
  local_78._splits = (SplitSet *)0x5;
  pLVar3 = Kernel::Literal::create(uVar2,3,true,(TermList *)&local_78);
  if (local_98._cursor == local_98._end) {
    ::Lib::Stack<Kernel::Literal_*>::expand(&local_98);
  }
  *local_98._cursor = pLVar3;
  local_98._cursor = local_98._cursor + 1;
  local_40.premise = this->_defUnit;
  local_40.rule = EQUALITY_PROXY_AXIOM2;
  Kernel::Inference::Inference(&local_78,&local_40);
  pCVar4 = Kernel::Clause::fromStack(&local_98,&local_78);
  pUVar1 = *units;
  pUVar5 = (UnitList *)
           ::Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  pUVar5->_head = &pCVar4->super_Unit;
  pUVar5->_tail = pUVar1;
  *units = pUVar5;
  if (this->_opt - RS < 3) {
    local_98._cursor = local_98._stack;
    uVar2 = getProxyPredicate(this);
    local_78._0_8_ = 1;
    local_78._8_4_ = 5;
    local_78._age = 0;
    local_78._splits = (SplitSet *)0x9;
    pLVar3 = Kernel::Literal::create(uVar2,3,false,(TermList *)&local_78);
    if (local_98._cursor == local_98._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_98);
    }
    *local_98._cursor = pLVar3;
    local_98._cursor = local_98._cursor + 1;
    uVar2 = getProxyPredicate(this);
    local_78._0_8_ = 1;
    local_78._8_4_ = 9;
    local_78._age = 0;
    local_78._splits = (SplitSet *)0x5;
    pLVar3 = Kernel::Literal::create(uVar2,3,true,(TermList *)&local_78);
    if (local_98._cursor == local_98._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_98);
    }
    *local_98._cursor = pLVar3;
    local_98._cursor = local_98._cursor + 1;
    local_40.premise = this->_defUnit;
    local_40.rule = EQUALITY_PROXY_AXIOM2;
    Kernel::Inference::Inference(&local_78,&local_40);
    pCVar4 = Kernel::Clause::fromStack(&local_98,&local_78);
    pUVar1 = *units;
    pUVar5 = (UnitList *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar5->_head = &pCVar4->super_Unit;
    pUVar5->_tail = pUVar1;
    *units = pUVar5;
  }
  if ((this->_opt & ~RS) == RST) {
    local_98._cursor = local_98._stack;
    uVar2 = getProxyPredicate(this);
    local_78._0_8_ = 1;
    local_78._8_4_ = 5;
    local_78._age = 0;
    local_78._splits = (SplitSet *)0x9;
    pLVar3 = Kernel::Literal::create(uVar2,3,false,(TermList *)&local_78);
    if (local_98._cursor == local_98._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_98);
    }
    *local_98._cursor = pLVar3;
    local_98._cursor = local_98._cursor + 1;
    uVar2 = getProxyPredicate(this);
    local_78._0_8_ = 1;
    local_78._8_4_ = 9;
    local_78._age = 0;
    local_78._splits = (SplitSet *)0xd;
    pLVar3 = Kernel::Literal::create(uVar2,3,false,(TermList *)&local_78);
    if (local_98._cursor == local_98._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_98);
    }
    *local_98._cursor = pLVar3;
    local_98._cursor = local_98._cursor + 1;
    uVar2 = getProxyPredicate(this);
    local_78._0_8_ = 1;
    local_78._8_4_ = 5;
    local_78._age = 0;
    local_78._splits = (SplitSet *)0xd;
    pLVar3 = Kernel::Literal::create(uVar2,3,true,(TermList *)&local_78);
    if (local_98._cursor == local_98._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_98);
    }
    *local_98._cursor = pLVar3;
    local_98._cursor = local_98._cursor + 1;
    local_40.premise = this->_defUnit;
    local_40.rule = EQUALITY_PROXY_AXIOM2;
    Kernel::Inference::Inference(&local_78,&local_40);
    pCVar4 = Kernel::Clause::fromStack(&local_98,&local_78);
    pUVar1 = *units;
    pUVar5 = (UnitList *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar5->_head = &pCVar4->super_Unit;
    pUVar5->_tail = pUVar1;
    *units = pUVar5;
  }
  if (local_98._stack != (Literal **)0x0) {
    uVar6 = local_98._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *local_98._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._stack;
    }
    else if (uVar6 < 0x11) {
      *local_98._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._stack;
    }
    else if (uVar6 < 0x19) {
      *local_98._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._stack;
    }
    else if (uVar6 < 0x21) {
      *local_98._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._stack;
    }
    else if (uVar6 < 0x31) {
      *local_98._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._stack;
    }
    else if (uVar6 < 0x41) {
      *local_98._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._stack;
    }
    else {
      operator_delete(local_98._stack,0x10);
    }
  }
  return;
}

Assistant:

void EqualityProxy::addLocalAxioms(UnitList*& units)
{
  // reflexivity
  Stack<Literal*> lits;
  TermList sort = TermList(false, 0);

  lits.push(makeProxyLiteral(true,TermList(1,false),TermList(1,false), sort));
  UnitList::push(createEqProxyAxiom(lits),units);

  // symmetry
  if (_opt == Options::EqualityProxy::RS || _opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(true,TermList(2,false),TermList(1,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
  // transitivity
  if (_opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(false,TermList(2,false),TermList(3,false), sort));
    lits.push(makeProxyLiteral(true,TermList(1,false),TermList(3,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
}